

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O2

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitResume
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,Resume *curr,
          optional<wasm::HeapType> ct)

{
  bool bVar1;
  size_t sVar2;
  Expression **ppEVar3;
  Type *pTVar4;
  size_t i;
  ulong index;
  Signature SVar5;
  HeapType local_60;
  Type local_58;
  Type local_50;
  Type params;
  _Storage<wasm::HeapType,_true> local_40;
  optional<wasm::HeapType> ct_local;
  
  local_40 = ct.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType>._M_payload;
  ct_local.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ =
       ct.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType>._M_engaged;
  if (((undefined1  [16])
       ct.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) ==
      (undefined1  [16])0x0) {
    local_40._M_value = wasm::Type::getHeapType(&curr->cont->type);
    ct_local.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ = 1;
  }
  bVar1 = HeapType::isContinuation(&local_40._M_value);
  if (bVar1) {
    local_60.id = (uintptr_t)HeapType::getContinuation(&local_40._M_value);
    SVar5 = HeapType::getSignature(&local_60);
    local_50 = SVar5.params.id;
    sVar2 = wasm::Type::size(&local_50);
    if (sVar2 == (curr->operands).
                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                 usedElements) {
      index = 0;
      params.id = (uintptr_t)curr;
      while( true ) {
        sVar2 = wasm::Type::size(&local_50);
        if (sVar2 <= index) break;
        ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            (&(curr->operands).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             ,index);
        pTVar4 = wasm::Type::operator[](&local_50,index);
        IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
                  ((ConstraintCollector *)this,ppEVar3,(Type)pTVar4->id);
        index = index + 1;
      }
      ppEVar3 = (Expression **)(params.id + 0x70);
      wasm::Type::Type(&local_58,local_40._M_value.id,Nullable,Inexact);
      IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
                ((ConstraintCollector *)this,ppEVar3,local_58);
      return;
    }
    __assert_fail("params.size() == curr->operands.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/child-typer.h"
                  ,0x470,
                  "void wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitResume(Resume *, std::optional<HeapType>) [Subtype = wasm::IRBuilder::ChildPopper::ConstraintCollector]"
                 );
  }
  __assert_fail("ct->isContinuation()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/child-typer.h"
                ,0x46e,
                "void wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitResume(Resume *, std::optional<HeapType>) [Subtype = wasm::IRBuilder::ChildPopper::ConstraintCollector]"
               );
}

Assistant:

void visitResume(Resume* curr, std::optional<HeapType> ct = std::nullopt) {
    if (!ct.has_value()) {
      ct = curr->cont->type.getHeapType();
    }
    assert(ct->isContinuation());
    auto params = ct->getContinuation().type.getSignature().params;
    assert(params.size() == curr->operands.size());
    for (size_t i = 0; i < params.size(); ++i) {
      note(&curr->operands[i], params[i]);
    }
    note(&curr->cont, Type(*ct, Nullable));
  }